

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmganalysis.cpp
# Opt level: O1

void __thiscall TPZMGAnalysis::SolveInternal<double>(TPZMGAnalysis *this)

{
  TPZSolutionMatrix *this_00;
  TPZFMatrix<std::complex<double>_> *A;
  ESolType EVar1;
  long *plVar2;
  TPZBaseMatrix *pTVar3;
  TPZMatrix<double> *pTVar4;
  int iVar5;
  undefined4 extraout_var;
  TPZFMatrix<double> *pTVar6;
  TPZFMatrix<double> *pTVar7;
  TPZSolutionMatrix *pTVar8;
  long lVar9;
  ostream *poVar10;
  long *plVar11;
  ulong uVar12;
  ulong __n;
  double dVar13;
  double extraout_XMM0_Qa;
  TPZFMatrix<double> delu;
  TPZFMatrix<double> residual;
  TPZAutoPointer<TPZMatrix<double>_> local_168;
  double local_160;
  int64_t local_158;
  TPZFMatrix<double> local_150;
  TPZFMatrix<double> local_c0;
  
  if ((this->fMeshes).super_TPZManVector<TPZCompMesh_*,_10>.super_TPZVec<TPZCompMesh_*>.fNElements
      == 1) {
    TPZLinearAnalysis::Solve(&this->super_TPZLinearAnalysis);
    if ((this->fSolvers).super_TPZManVector<TPZMatrixSolver<double>_*,_10>.
        super_TPZVec<TPZMatrixSolver<double>_*>.fNElements == 0) {
      iVar5 = (*(((this->super_TPZLinearAnalysis).super_TPZAnalysis.fSolver)->super_TPZSavable).
                _vptr_TPZSavable[9])();
      (*(this->fSolvers).super_TPZManVector<TPZMatrixSolver<double>_*,_10>.
        super_TPZVec<TPZMatrixSolver<double>_*>._vptr_TPZVec[3])
                (&this->fSolvers,
                 (this->fSolvers).super_TPZManVector<TPZMatrixSolver<double>_*,_10>.
                 super_TPZVec<TPZMatrixSolver<double>_*>.fNElements + 1);
      (this->fSolvers).super_TPZManVector<TPZMatrixSolver<double>_*,_10>.
      super_TPZVec<TPZMatrixSolver<double>_*>.fStore
      [(this->fSolvers).super_TPZManVector<TPZMatrixSolver<double>_*,_10>.
       super_TPZVec<TPZMatrixSolver<double>_*>.fNElements + -1] =
           (TPZMatrixSolver<double> *)CONCAT44(extraout_var,iVar5);
    }
    if ((this->fPrecondition).super_TPZManVector<TPZMatrixSolver<double>_*,_10>.
        super_TPZVec<TPZMatrixSolver<double>_*>.fNElements == 0) {
      (*(this->fPrecondition).super_TPZManVector<TPZMatrixSolver<double>_*,_10>.
        super_TPZVec<TPZMatrixSolver<double>_*>._vptr_TPZVec[3])(&this->fPrecondition,1);
      (this->fPrecondition).super_TPZManVector<TPZMatrixSolver<double>_*,_10>.
      super_TPZVec<TPZMatrixSolver<double>_*>.fStore
      [(this->fPrecondition).super_TPZManVector<TPZMatrixSolver<double>_*,_10>.
       super_TPZVec<TPZMatrixSolver<double>_*>.fNElements + -1] = (TPZMatrixSolver<double> *)0x0;
    }
    lVar9 = (this->fSolutions).super_TPZManVector<TPZSolutionMatrix_*,_10>.
            super_TPZVec<TPZSolutionMatrix_*>.fNElements;
    if (lVar9 == 0) {
      pTVar8 = (TPZSolutionMatrix *)operator_new(0x138);
      TPZSolutionMatrix::TPZSolutionMatrix
                (pTVar8,&(this->super_TPZLinearAnalysis).super_TPZAnalysis.fSolution);
      (*(this->fSolutions).super_TPZManVector<TPZSolutionMatrix_*,_10>.
        super_TPZVec<TPZSolutionMatrix_*>._vptr_TPZVec[3])
                (&this->fSolutions,
                 (this->fSolutions).super_TPZManVector<TPZSolutionMatrix_*,_10>.
                 super_TPZVec<TPZSolutionMatrix_*>.fNElements + 1);
      (this->fSolutions).super_TPZManVector<TPZSolutionMatrix_*,_10>.
      super_TPZVec<TPZSolutionMatrix_*>.fStore
      [(this->fSolutions).super_TPZManVector<TPZSolutionMatrix_*,_10>.
       super_TPZVec<TPZSolutionMatrix_*>.fNElements + -1] = pTVar8;
      return;
    }
    TPZSolutionMatrix::operator=
              (*(TPZSolutionMatrix **)
                ((long)(this->fSolutions).super_TPZManVector<TPZSolutionMatrix_*,_10>.
                       super_TPZVec<TPZSolutionMatrix_*>.fStore +
                ((lVar9 << 0x20) + -0x100000000 >> 0x1d)),
               &(this->super_TPZLinearAnalysis).super_TPZAnalysis.fSolution);
    return;
  }
  local_158 = TPZCompMesh::NEquations((this->super_TPZLinearAnalysis).super_TPZAnalysis.fCompMesh);
  uVar12 = (ulong)(int)local_158;
  if (((this->super_TPZLinearAnalysis).fRhs.fBaseMatrix)->fRow != uVar12) {
    return;
  }
  pTVar8 = &(this->super_TPZLinearAnalysis).fRhs;
  lVar9 = (this->fSolvers).super_TPZManVector<TPZMatrixSolver<double>_*,_10>.
          super_TPZVec<TPZMatrixSolver<double>_*>.fNElements;
  pTVar6 = TPZSolutionMatrix::operator_cast_to_TPZFMatrix_(pTVar8);
  TPZFMatrix<double>::TPZFMatrix(&local_c0,pTVar6);
  local_150.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 1;
  local_150.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_150.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_150.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_0183c898;
  local_150.fElem = (double *)0x0;
  local_150.fGiven = (double *)0x0;
  local_150.fSize = 0;
  local_150.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = uVar12;
  TPZVec<int>::TPZVec(&local_150.fPivot.super_TPZVec<int>,0);
  local_150.fPivot.super_TPZVec<int>.fStore = local_150.fPivot.fExtAlloc;
  local_150.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_150.fPivot.super_TPZVec<int>.fNElements = 0;
  local_150.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_150.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
  local_150.fWork.fStore = (double *)0x0;
  local_150.fWork.fNElements = 0;
  local_150.fWork.fNAlloc = 0;
  if (local_158 << 0x20 != 0) {
    __n = (local_158 << 0x20) >> 0x1d;
    local_150.fElem = (double *)operator_new__(-(ulong)(uVar12 >> 0x3d != 0) | __n);
    if (0 < (long)uVar12) {
      memset(local_150.fElem,0,__n);
    }
  }
  plVar2 = *(long **)((long)(this->fSolvers).super_TPZManVector<TPZMatrixSolver<double>_*,_10>.
                            super_TPZVec<TPZMatrixSolver<double>_*>.fStore +
                     ((lVar9 << 0x20) + -0x100000000 >> 0x1d));
  this_00 = &(this->super_TPZLinearAnalysis).super_TPZAnalysis.fSolution;
  pTVar3 = (this->super_TPZLinearAnalysis).super_TPZAnalysis.fSolution.fBaseMatrix;
  if (pTVar3->fRow == uVar12) {
    local_168.fRef = (TPZReference *)plVar2[0x14];
    LOCK();
    ((local_168.fRef)->fCounter).super___atomic_base<int>._M_i =
         ((local_168.fRef)->fCounter).super___atomic_base<int>._M_i + 1;
    UNLOCK();
    pTVar4 = (local_168.fRef)->fPointer;
    pTVar6 = TPZSolutionMatrix::operator_cast_to_TPZFMatrix_(this_00);
    pTVar7 = TPZSolutionMatrix::operator_cast_to_TPZFMatrix_(pTVar8);
    (*(pTVar4->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x28])
              (pTVar4,pTVar6,pTVar7,&local_c0);
    TPZAutoPointer<TPZMatrix<double>_>::~TPZAutoPointer(&local_168);
  }
  else if (pTVar3 != (TPZBaseMatrix *)0x0) {
    (*(pTVar3->super_TPZSavable)._vptr_TPZSavable[0xe])(pTVar3,uVar12,1);
  }
  EVar1 = (this->super_TPZLinearAnalysis).fRhs.fSolType;
  if (EVar1 == EComplex) {
    A = &(this->super_TPZLinearAnalysis).fRhs.fComplexMatrix;
    Dot<std::complex<double>>(A,A);
    dVar13 = extraout_XMM0_Qa;
  }
  else {
    if (EVar1 != EReal) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"STATE Norm(const TPZSolutionMatrix &)",0x25);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Type is not set. Aborting...\n",0x1d);
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/TPZSolutionMatrix.h"
                 ,0x98);
    }
    pTVar6 = &(this->super_TPZLinearAnalysis).fRhs.fRealMatrix;
    dVar13 = Dot<double>(pTVar6,pTVar6);
  }
  if (dVar13 < 0.0) {
    dVar13 = sqrt(dVar13);
  }
  else {
    dVar13 = SQRT(dVar13);
  }
  local_160 = Dot<double>(&local_c0,&local_c0);
  if (local_160 < 0.0) {
    local_160 = sqrt(local_160);
  }
  else {
    local_160 = SQRT(local_160);
  }
  if (local_160 <= dVar13 * 1e-06) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"TPZMGAnalysis::Solve no need for iterations normrhs = ",0x36);
    poVar10 = std::ostream::_M_insert<double>(dVar13);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," normres = ",0xb);
    poVar10 = std::ostream::_M_insert<double>(local_160);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    lVar9 = (this->fSolutions).super_TPZManVector<TPZSolutionMatrix_*,_10>.
            super_TPZVec<TPZSolutionMatrix_*>.fNElements;
    if ((this->fMeshes).super_TPZManVector<TPZCompMesh_*,_10>.super_TPZVec<TPZCompMesh_*>.fNElements
        <= lVar9) {
      TPZSolutionMatrix::operator=
                (*(TPZSolutionMatrix **)
                  ((long)(this->fSolutions).super_TPZManVector<TPZSolutionMatrix_*,_10>.
                         super_TPZVec<TPZSolutionMatrix_*>.fStore +
                  ((lVar9 << 0x20) + -0x100000000 >> 0x1d)),this_00);
      goto LAB_0128bb41;
    }
    pTVar8 = (TPZSolutionMatrix *)operator_new(0x138);
    TPZSolutionMatrix::TPZSolutionMatrix(pTVar8,this_00);
    (*(this->fSolutions).super_TPZManVector<TPZSolutionMatrix_*,_10>.
      super_TPZVec<TPZSolutionMatrix_*>._vptr_TPZVec[3])
              (&this->fSolutions,
               (this->fSolutions).super_TPZManVector<TPZSolutionMatrix_*,_10>.
               super_TPZVec<TPZSolutionMatrix_*>.fNElements + 1);
  }
  else {
    if (plVar2 == (long *)0x0) {
      lVar9 = 0;
    }
    else {
      lVar9 = __dynamic_cast(plVar2,&TPZMatrixSolver<double>::typeinfo,
                             &TPZStepSolver<double>::typeinfo,0);
    }
    if (lVar9 != 0) {
      *(double *)(lVar9 + 200) = (dVar13 * 1e-06) / local_160;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"TPZMGAnalysis::Run res : ",0x19);
    dVar13 = Dot<double>(&local_c0,&local_c0);
    if (dVar13 < 0.0) {
      dVar13 = sqrt(dVar13);
    }
    else {
      dVar13 = SQRT(dVar13);
    }
    poVar10 = std::ostream::_M_insert<double>(dVar13);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," neq ",5);
    plVar11 = (long *)std::ostream::operator<<(poVar10,(int)local_158);
    std::ios::widen((char)*(undefined8 *)(*plVar11 + -0x18) + (char)plVar11);
    std::ostream::put((char)plVar11);
    std::ostream::flush();
    (**(code **)(*plVar2 + 0x58))(plVar2,&local_c0,&local_150,0);
    pTVar6 = TPZSolutionMatrix::operator_cast_to_TPZFMatrix_(this_00);
    TPZFMatrix<double>::operator+=(pTVar6,&local_150.super_TPZMatrix<double>);
    TPZCompMesh::LoadSolution((this->super_TPZLinearAnalysis).super_TPZAnalysis.fCompMesh,this_00);
    lVar9 = (this->fSolutions).super_TPZManVector<TPZSolutionMatrix_*,_10>.
            super_TPZVec<TPZSolutionMatrix_*>.fNElements;
    if ((this->fMeshes).super_TPZManVector<TPZCompMesh_*,_10>.super_TPZVec<TPZCompMesh_*>.fNElements
        <= lVar9) {
      TPZSolutionMatrix::operator=
                (*(TPZSolutionMatrix **)
                  ((long)(this->fSolutions).super_TPZManVector<TPZSolutionMatrix_*,_10>.
                         super_TPZVec<TPZSolutionMatrix_*>.fStore +
                  ((lVar9 << 0x20) + -0x100000000 >> 0x1d)),this_00);
      goto LAB_0128bb41;
    }
    pTVar8 = (TPZSolutionMatrix *)operator_new(0x138);
    TPZSolutionMatrix::TPZSolutionMatrix(pTVar8,this_00);
    (*(this->fSolutions).super_TPZManVector<TPZSolutionMatrix_*,_10>.
      super_TPZVec<TPZSolutionMatrix_*>._vptr_TPZVec[3])
              (&this->fSolutions,
               (this->fSolutions).super_TPZManVector<TPZSolutionMatrix_*,_10>.
               super_TPZVec<TPZSolutionMatrix_*>.fNElements + 1);
  }
  (this->fSolutions).super_TPZManVector<TPZSolutionMatrix_*,_10>.super_TPZVec<TPZSolutionMatrix_*>.
  fStore[(this->fSolutions).super_TPZManVector<TPZSolutionMatrix_*,_10>.
         super_TPZVec<TPZSolutionMatrix_*>.fNElements + -1] = pTVar8;
LAB_0128bb41:
  TPZFMatrix<double>::~TPZFMatrix(&local_150);
  TPZFMatrix<double>::~TPZFMatrix(&local_c0);
  return;
}

Assistant:

void TPZMGAnalysis::SolveInternal()
{
  if(fMeshes.NElements() == 1) {
		TPZLinearAnalysis::Solve();
		if(fSolvers.NElements() == 0) {
			fSolvers.Push((TPZMatrixSolver<TVar> *) fSolver->Clone());
		}
		if(fPrecondition.NElements() == 0) {
			fPrecondition.Push(0);
		}
		if(fSolutions.NElements() == 0) {
			fSolutions.Push(new TPZSolutionMatrix(fSolution));
		} else {
			int nsol = fSolutions.NElements();
			*(fSolutions[nsol-1]) = fSolution;
		}
		return;
	}
	int numeq = fCompMesh->NEquations();
	if(fRhs.Rows() != numeq ) return;
	int nsolvers = fSolvers.NElements();
	
	TPZFMatrix<TVar> residual(fRhs);
	TPZFMatrix<TVar> delu(numeq,1,0.);
	TPZMatrixSolver<TVar> *solve = dynamic_cast<TPZMatrixSolver<TVar> *> (fSolvers[nsolvers-1]);
	if(fSolution.Rows() != numeq) {
		fSolution.Redim(numeq,1);
	} else {
		solve->Matrix()->Residual(fSolution,fRhs,residual);
	}
	
	REAL normrhs = Norm(fRhs);
	REAL normres  = Norm(residual);
	if(normrhs*1.e-6 >= normres) {
		cout << "TPZMGAnalysis::Solve no need for iterations normrhs = " << normrhs << " normres = " << normres << endl;
		if(fSolutions.NElements() < fMeshes.NElements()) {
			fSolutions.Push(new TPZSolutionMatrix(fSolution));
		} else {
			int nsol = fSolutions.NElements();
			*(fSolutions[nsol-1]) = fSolution;
		}
		return ;
	}
	
	TPZStepSolver<TVar> *stepsolve = dynamic_cast<TPZStepSolver<TVar> *> (solve);
	if(stepsolve) stepsolve->SetTolerance(1.e-6*normrhs/normres);
	cout << "TPZMGAnalysis::Run res : " << Norm(residual) << " neq " << numeq << endl;
	solve->Solve(residual, delu);
	TPZFMatrix<TVar> &mysol = fSolution;
	mysol += delu;

	fCompMesh->LoadSolution(fSolution);
	if(fSolutions.NElements() < fMeshes.NElements()) {
		fSolutions.Push(new TPZSolutionMatrix(fSolution));
	} else {
		int nsol = fSolutions.NElements();
		*(fSolutions[nsol-1]) = fSolution;
	}
}